

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

void duckdb_re2::ConvertRunesToBytes(bool latin1,Rune *runes,int nrunes,string *bytes)

{
  int iVar1;
  ulong uVar2;
  pointer str;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,latin1) == 0) {
    std::__cxx11::string::resize((ulong)bytes,(char)nrunes * '\x04');
    str = (bytes->_M_dataplus)._M_p;
    if (0 < nrunes) {
      uVar2 = (ulong)(uint)nrunes;
      do {
        iVar1 = runetochar(str,runes);
        str = str + iVar1;
        runes = runes + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    std::__cxx11::string::resize((ulong)bytes,(char)str - (char)(bytes->_M_dataplus)._M_p);
    std::__cxx11::string::reserve();
  }
  else {
    std::__cxx11::string::resize((ulong)bytes,(char)nrunes);
    if (0 < nrunes) {
      uVar2 = 0;
      do {
        (bytes->_M_dataplus)._M_p[uVar2] = (char)runes[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)nrunes != uVar2);
    }
  }
  return;
}

Assistant:

void ConvertRunesToBytes(bool latin1, Rune* runes, int nrunes,
                         std::string* bytes) {
  if (latin1) {
    bytes->resize(nrunes);
    for (int i = 0; i < nrunes; i++)
      (*bytes)[i] = static_cast<char>(runes[i]);
  } else {
    bytes->resize(nrunes * UTFmax);  // worst case
    char* p = &(*bytes)[0];
    for (int i = 0; i < nrunes; i++)
      p += runetochar(p, &runes[i]);
    bytes->resize(p - &(*bytes)[0]);
    bytes->shrink_to_fit();
  }
}